

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerSafe::SetSecurePendingDataset
          (CommissionerSafe *this,ErrorHandler *aHandler,uint32_t aMaxRetrievalTimer,
          PendingOperationalDataset *aDataset)

{
  _func_void *p_Var1;
  _Any_data local_168;
  code *local_158;
  code *pcStack_150;
  CommissionerSafe *local_140;
  _Any_data local_138;
  long local_128;
  undefined8 uStack_120;
  uint32_t local_118;
  PendingOperationalDataset local_110;
  
  local_140 = this;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_138,aHandler);
  local_118 = aMaxRetrievalTimer;
  PendingOperationalDataset::PendingOperationalDataset(&local_110,aDataset);
  local_158 = (code *)0x0;
  pcStack_150 = (code *)0x0;
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  p_Var1 = (_func_void *)operator_new(0x110);
  *(CommissionerSafe **)p_Var1 = local_140;
  *(undefined8 *)(p_Var1 + 8) = 0;
  *(undefined8 *)(p_Var1 + 0x10) = 0;
  *(undefined8 *)(p_Var1 + 0x18) = 0;
  *(undefined8 *)(p_Var1 + 0x20) = uStack_120;
  if (local_128 != 0) {
    *(void **)(p_Var1 + 8) = local_138._M_unused._M_object;
    *(undefined8 *)(p_Var1 + 0x10) = local_138._8_8_;
    *(long *)(p_Var1 + 0x18) = local_128;
    local_128 = 0;
    uStack_120 = 0;
  }
  *(uint32_t *)(p_Var1 + 0x28) = local_118;
  PendingOperationalDataset::PendingOperationalDataset
            ((PendingOperationalDataset *)(p_Var1 + 0x30),&local_110);
  pcStack_150 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:385:22)>
                ::_M_invoke;
  local_158 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:385:22)>
              ::_M_manager;
  local_168._M_unused._0_8_ = (undefined8)p_Var1;
  PushAsyncRequest(this,(AsyncRequest *)&local_168);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  SetSecurePendingDataset(std::function<void(ot::commissioner::Error)>,unsigned_int,ot::commissioner::PendingOperationalDataset_const&)
  ::$_0::~__0((__0 *)&local_140);
  return;
}

Assistant:

void CommissionerSafe::SetSecurePendingDataset(ErrorHandler                     aHandler,
                                               uint32_t                         aMaxRetrievalTimer,
                                               const PendingOperationalDataset &aDataset)
{
    PushAsyncRequest([=]() { mImpl->SetSecurePendingDataset(aHandler, aMaxRetrievalTimer, aDataset); });
}